

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::loadstart(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  _Rb_tree_header *p_Var1;
  CAddr CVar2;
  _Base_ptr *pp_Var3;
  _Rb_tree_color x;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  Cell i;
  int iVar7;
  bool bVar8;
  
  requireDStackDepth(this,1,"LOADSTART");
  this_00 = &this->dStack;
  x = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (x == _S_red) {
    return;
  }
  p_Var4 = (this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var1->_M_header;
  p_Var6 = p_Var4;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      bVar8 = p_Var6[1]._M_color < x;
      if (!bVar8) {
        p_Var5 = p_Var6;
      }
      pp_Var3 = &p_Var6->_M_left;
      p_Var6 = pp_Var3[bVar8];
    } while (pp_Var3[bVar8] != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var5[1]._M_color <= x)) goto LAB_00114fe6;
  }
  ForthStack<unsigned_int>::push(this_00,x);
  block(this);
  ForthStack<unsigned_int>::pop(this_00);
  p_Var4 = (this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
LAB_00114fe6:
  p_Var5 = &p_Var1->_M_header;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      bVar8 = p_Var4[1]._M_color < x;
      if (!bVar8) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar8];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var5[1]._M_color <= x)) {
      SaveInput(this);
      this->sourceid = 0;
      CVar2 = this->VarOffsetBlkAddress;
      iVar7 = 0;
      do {
        dataSpaceSet(this,CVar2 + iVar7,(Char)x);
        x = x >> 8;
        iVar7 = iVar7 + 1;
      } while (iVar7 != 4);
      setSourceVariables(this,*(Cell *)&p_Var5[1]._M_parent,0x400,0);
      this->InterpretState = InterpretSource;
    }
  }
  return;
}

Assistant:

void loadstart(){
			REQUIRE_DSTACK_DEPTH(1, "LOADSTART");
			Cell u = dStack.getTop(); pop();
			if(u>0){
				auto foundIt = blocksInProcess.find(u);
				if (foundIt == blocksInProcess.end()) {
					push(u);
					block();
					pop();
				}
				foundIt = blocksInProcess.find(u);
				if (foundIt != blocksInProcess.end()) {
					SaveInput();
					setSourceId(0);
					setDataCell(VarOffsetBlkAddress, Cell(u)); // set BLK=u
					setSourceVariables((*foundIt).second.blockLocation, 1024, 0);
					InterpretState = InterpretSource;
				} 
			}
		}